

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlink-ipi.c
# Opt level: O0

mraa_result_t pwm_write_replace(mraa_pwm_context dev,float duty)

{
  ssize_t sVar1;
  uchar local_20;
  undefined1 uStack_1f;
  undefined1 local_1e;
  float local_1c;
  uchar rx_tx_buf [3];
  float duty_local;
  mraa_pwm_context dev_local;
  
  local_1e = 0;
  IonValue[dev->pin] = (uint)(long)((duty / (float)m_period) * 255.0);
  if (dev->pin < 9) {
    if (_fd == -1) {
      dev_local._4_4_ = MRAA_ERROR_INVALID_RESOURCE;
    }
    else {
      _local_20 = CONCAT11((char)IonValue[dev->pin],regIon[dev->pin]);
      local_1c = duty;
      _rx_tx_buf = dev;
      sVar1 = write(_fd,&local_20,2);
      if (sVar1 == 2) {
        dev_local._4_4_ = MRAA_SUCCESS;
      }
      else {
        dev_local._4_4_ = MRAA_ERROR_NO_RESOURCES;
      }
    }
  }
  else {
    dev_local._4_4_ = MRAA_ERROR_NO_RESOURCES;
  }
  return dev_local._4_4_;
}

Assistant:

static mraa_result_t pwm_write_replace(mraa_pwm_context dev, float duty)
{
	unsigned char rx_tx_buf[3] = {0};

	IonValue[dev->pin] = ((duty /m_period) * 255);

	if(dev->pin < 9)
	{
		if(_fd == -1)
		{
			return MRAA_ERROR_INVALID_RESOURCE;
		}

		rx_tx_buf[0] = regIon[dev->pin];
		rx_tx_buf[1] = IonValue[dev->pin];

		if(write(_fd, &(rx_tx_buf[0]), 2) != 2)
		{
			return MRAA_ERROR_NO_RESOURCES;
		}
		return MRAA_SUCCESS;
	}
	return MRAA_ERROR_NO_RESOURCES;
}